

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
               *this,int i)

{
  long in_RSI;
  value_type *in_RDI;
  value_type *pvVar1;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *in_stack_ffffffffffffffc8;
  Fad<double> *in_stack_ffffffffffffffd0;
  Fad<double> *in_stack_ffffffffffffffd8;
  
  pvVar1 = in_RDI;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_> *)
             in_RDI,(int)((ulong)in_RDI >> 0x20));
  FadCst<double>::val((FadCst<double> *)(in_RSI + 8));
  operator*<Fad<double>,_double,_nullptr>
            (in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0);
  Fad<double>::Fad<FadBinaryMul<Fad<double>,FadCst<double>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  return pvVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val();}